

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O1

void __thiscall ChatRoom::message(ChatRoom *this,string *origin,string *dest,string *message)

{
  shared_ptr<Person> *psVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  _Var4;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
  __it_00;
  string *local_40;
  string *local_38;
  
  __it._M_current =
       (this->m_people).
       super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_people).
           super__Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)__it._M_current >> 6;
  __it_00._M_current = __it._M_current;
  local_40 = dest;
  local_38 = origin;
  if (0 < lVar3) {
    __it_00._M_current =
         (shared_ptr<Person> *)
         ((long)&((__it._M_current)->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         + ((long)psVar1 - (long)__it._M_current & 0xffffffffffffffc0U));
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_40,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_001026e3;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_40,__it._M_current + 1);
      _Var4._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_001026e3;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_40,__it._M_current + 2);
      _Var4._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_001026e3;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_40,__it._M_current + 3);
      _Var4._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_001026e3;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)psVar1 - (long)__it_00._M_current >> 4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = psVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                                *)&local_40,__it_00), _Var4._M_current = __it_00._M_current, bVar2))
      goto LAB_001026e3;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_40,__it_00);
    _Var4._M_current = __it_00._M_current;
    if (bVar2) goto LAB_001026e3;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<ChatRoom::message(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        *)&local_40,__it_00);
  _Var4._M_current = __it_00._M_current;
  if (!bVar2) {
    _Var4._M_current = psVar1;
  }
LAB_001026e3:
  if (_Var4._M_current == psVar1) {
    return;
  }
  Person::recieve(((_Var4._M_current)->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,local_38,message);
  return;
}

Assistant:

void ChatRoom::message(const std::string& origin, const std::string& dest, const std::string& message)
{
	auto it{std::find_if(m_people.begin(), m_people.end(), [&dest] (const auto& p)
			{
				return p->m_name == dest;
			})};

	if(it != m_people.end())
	{
		(*it)->recieve(origin, message);
	};
}